

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManAbsPrintFrame(Ga2_Man_t *p,int nFrames,int nConfls,int nCexes,abctime Time,int fFinal)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  int level;
  Ga2_Man_t *pGVar6;
  sat_solver2 *s;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  bVar7 = true;
  if (nCexes == 0 || fFinal == 0) {
    bVar7 = p->pPars->fVeryVerbose != 0;
  }
  pGVar6 = p;
  iVar2 = Abc_FrameIsBatchMode();
  level = (int)pGVar6;
  if ((iVar2 != 0) && (bVar7 == false)) {
    return;
  }
  p->fUseNewLine = (uint)bVar7;
  Abc_Print(level,"%4d :",(ulong)(uint)nFrames);
  uVar4 = (long)(p->vAbs->nSize * 100) / (long)p->nMarked;
  uVar1 = 100;
  if ((int)uVar4 < 100) {
    uVar1 = uVar4;
  }
  Abc_Print(level,"%4d",uVar1 & 0xffffffff);
  Abc_Print(level,"%6d",(ulong)(uint)p->vAbs->nSize);
  Abc_Print(level,"%5d",(ulong)(uint)(~p->vAbs->nSize + p->vValues->nSize));
  pGVar6 = p;
  uVar3 = Ga2_GlaAbsCount(p,1,0);
  Abc_Print((int)pGVar6,"%5d",(ulong)uVar3);
  pGVar6 = p;
  uVar3 = Ga2_GlaAbsCount(p,0,1);
  iVar2 = (int)pGVar6;
  Abc_Print(iVar2,"%6d",(ulong)uVar3);
  Abc_Print(iVar2,"%8d",(ulong)(uint)nConfls);
  if (nCexes == 0) {
    pcVar5 = "%5c";
    uVar4 = 0x2d;
  }
  else {
    pcVar5 = "%5d";
    uVar4 = (ulong)(uint)nCexes;
  }
  Abc_Print(iVar2,pcVar5,uVar4);
  Abc_PrintInt(p->pSat->size);
  Abc_PrintInt((p->pSat->stats).clauses);
  uVar3 = (p->pSat->stats).learnts;
  Abc_PrintInt(uVar3);
  Abc_Print(uVar3,"%9.2f sec",(double)Time / 1000000.0);
  dVar8 = sat_solver2_memory_proof(p->pSat);
  s = p->pSat;
  dVar9 = sat_solver2_memory(s,0);
  iVar2 = (int)s;
  Abc_Print(iVar2,"%5.0f MB",(dVar9 + dVar8) * 9.5367431640625e-07);
  pcVar5 = "\r";
  if (bVar7 != false) {
    pcVar5 = "\n";
  }
  Abc_Print(iVar2,"%s",pcVar5);
  fflush(_stdout);
  return;
}

Assistant:

void Ga2_ManAbsPrintFrame( Ga2_Man_t * p, int nFrames, int nConfls, int nCexes, abctime Time, int fFinal )
{
    int fUseNewLine = ((fFinal && nCexes) || p->pPars->fVeryVerbose);
    if ( Abc_FrameIsBatchMode() && !fUseNewLine )
        return;
    p->fUseNewLine = fUseNewLine;
    Abc_Print( 1, "%4d :", nFrames );
    Abc_Print( 1, "%4d", Abc_MinInt(100, 100 * Vec_IntSize(p->vAbs) / p->nMarked) ); 
    Abc_Print( 1, "%6d", Vec_IntSize(p->vAbs) );
    Abc_Print( 1, "%5d", Vec_IntSize(p->vValues)-Vec_IntSize(p->vAbs)-1 );
    Abc_Print( 1, "%5d", Ga2_GlaAbsCount(p, 1, 0) );
    Abc_Print( 1, "%6d", Ga2_GlaAbsCount(p, 0, 1) );
    Abc_Print( 1, "%8d", nConfls );
    if ( nCexes == 0 )
        Abc_Print( 1, "%5c", '-' ); 
    else
        Abc_Print( 1, "%5d", nCexes ); 
    Abc_PrintInt( sat_solver2_nvars(p->pSat) );
    Abc_PrintInt( sat_solver2_nclauses(p->pSat) );
    Abc_PrintInt( sat_solver2_nlearnts(p->pSat) );
    Abc_Print( 1, "%9.2f sec", 1.0*Time/CLOCKS_PER_SEC );
    Abc_Print( 1, "%5.0f MB", (sat_solver2_memory_proof(p->pSat) + sat_solver2_memory(p->pSat, 0)) / (1<<20) );
    Abc_Print( 1, "%s", fUseNewLine ? "\n" : "\r" );
    fflush( stdout );
}